

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O1

void ExchCXX::detail::host_eval_exc_vxc_helper_polar<ExchCXX::BuiltinPW91_LDA_RPA>
               (int N,const_host_buffer_type rho,host_buffer_type eps,host_buffer_type vxc)

{
  double dVar1;
  host_buffer_type vxc_i;
  long lVar2;
  double rho_a;
  double dVar3;
  
  if (0 < N) {
    lVar2 = 0;
    do {
      dVar3 = *(double *)((long)rho + lVar2 * 2);
      dVar1 = *(double *)((long)rho + lVar2 * 2 + 8);
      if (dVar3 + dVar1 <= 1e-24) {
        *(double *)((long)eps + lVar2) = 0.0;
        *vxc = 0.0;
        vxc[1] = 0.0;
      }
      else {
        rho_a = 1e-24;
        if (1e-24 <= dVar3) {
          rho_a = dVar3;
        }
        dVar3 = 1e-24;
        if (1e-24 <= dVar1) {
          dVar3 = dVar1;
        }
        kernel_traits<ExchCXX::BuiltinPW91_LDA_RPA>::eval_exc_vxc_polar_impl
                  (rho_a,dVar3,(double *)((long)eps + lVar2),vxc,vxc + 1);
      }
      vxc = vxc + 2;
      lVar2 = lVar2 + 8;
    } while ((ulong)(uint)N << 3 != lVar2);
  }
  return;
}

Assistant:

LDA_EXC_VXC_GENERATOR( host_eval_exc_vxc_helper_polar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    auto rho_i = rho + 2*i;
    auto vxc_i = vxc + 2*i;

    traits::eval_exc_vxc_polar( rho_i[0], rho_i[1], eps[i], 
      vxc_i[0], vxc_i[1] );

  }

}